

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void do_vec_ld(DisasContext_conflict1 *s,int destidx,int element,TCGv_i64 tcg_addr,int size,
              MemOp endian)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 val;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  val = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_qemu_ld_i64_aarch64(tcg_ctx,val,tcg_addr,(ulong)(s->mmu_idx & 0xf),endian | size);
  write_vec_element(s,val,destidx,element,size);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
  return;
}

Assistant:

static void do_vec_ld(DisasContext *s, int destidx, int element,
                      TCGv_i64 tcg_addr, int size, MemOp endian)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 tcg_tmp = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_qemu_ld_i64(tcg_ctx, tcg_tmp, tcg_addr, get_mem_index(s), endian | size);
    write_vec_element(s, tcg_tmp, destidx, element, size);

    tcg_temp_free_i64(tcg_ctx, tcg_tmp);
}